

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O2

REF_STATUS
ref_part_meshb_geom_bcast
          (REF_GEOM ref_geom,REF_LONG ngeom,REF_INT type,REF_NODE ref_node,REF_INT version,
          FILE *file)

{
  REF_LONG *value;
  long *plVar1;
  void *pvVar2;
  REF_MPI ref_mpi;
  REF_GEOM ref_geom_00;
  uint uVar3;
  REF_STATUS RVar4;
  long lVar5;
  void *__ptr;
  void *pvVar6;
  REF_DBL *pRVar7;
  ulong uVar8;
  undefined8 uVar9;
  REF_INT RVar10;
  ulong uVar11;
  char *pcVar12;
  size_t sVar13;
  REF_DBL *local_c0;
  REF_INT local;
  ulong local_a8;
  void *local_a0;
  ulong local_98;
  REF_DBL *local_90;
  REF_INT local_84;
  uint local_80;
  REF_INT new_geom;
  REF_MPI local_78;
  ulong local_70;
  FILE *local_68;
  long local_60;
  long local_58;
  ulong local_50;
  REF_GEOM local_48;
  REF_NODE local_40;
  REF_DBL double_gref;
  
  local_78 = ref_node->ref_mpi;
  lVar5 = ngeom / (long)local_78->n;
  uVar11 = (ulong)(int)lVar5;
  if (lVar5 < 1000000) {
    uVar11 = 1000000;
  }
  if (ngeom <= (long)uVar11) {
    uVar11 = ngeom;
  }
  uVar3 = (uint)uVar11;
  local_48 = ref_geom;
  local_40 = ref_node;
  if ((int)uVar3 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x160,
           "ref_part_meshb_geom_bcast","malloc read_node of REF_LONG negative");
LAB_001800ae:
    RVar4 = 1;
  }
  else {
    sVar13 = (ulong)(uVar3 & 0x7fffffff) << 3;
    __ptr = malloc(sVar13);
    RVar4 = 2;
    if (__ptr == (void *)0x0) {
      pcVar12 = "malloc read_node of REF_LONG NULL";
      uVar9 = 0x160;
    }
    else {
      pvVar6 = malloc(sVar13);
      if (pvVar6 == (void *)0x0) {
        pcVar12 = "malloc read_id of REF_LONG NULL";
        uVar9 = 0x161;
      }
      else {
        local_a0 = pvVar6;
        pvVar6 = malloc(sVar13);
        if (pvVar6 == (void *)0x0) {
          pcVar12 = "malloc read_gref of REF_LONG NULL";
          uVar9 = 0x162;
        }
        else {
          pRVar7 = (REF_DBL *)malloc((ulong)(uVar3 & 0x7fffffff) << 4);
          if (pRVar7 != (REF_DBL *)0x0) {
            uVar8 = 0;
            if (0 < type) {
              uVar8 = (ulong)(uint)type;
            }
            local_58 = uVar8 + 1;
            lVar5 = 0;
            local_90 = pRVar7;
            local_84 = version;
            do {
              if (ngeom <= lVar5) {
                free(pRVar7);
                free(pvVar6);
                free(local_a0);
                free(__ptr);
                return 0;
              }
              uVar3 = (int)ngeom - (int)lVar5;
              local_98 = (ulong)uVar3;
              if ((int)uVar11 < (int)uVar3) {
                local_98 = uVar11 & 0xffffffff;
              }
              local_60 = lVar5;
              if (local_78->id == 0) {
                local_70 = 0;
                if (0 < (int)local_98) {
                  local_70 = local_98;
                }
                uVar8 = 0;
                local_c0 = pRVar7;
                while (RVar10 = local_84, uVar8 != local_70) {
                  RVar4 = ref_part_meshb_long(file,local_84,(REF_LONG *)((long)__ptr + uVar8 * 8));
                  if (RVar4 != 0) {
                    pcVar12 = "node";
                    uVar3 = 1;
                    uVar9 = 0x16a;
                    goto LAB_001801dc;
                  }
                  value = (REF_LONG *)((long)local_a0 + uVar8 * 8);
                  RVar4 = ref_part_meshb_long(file,RVar10,value);
                  if (RVar4 != 0) {
                    pcVar12 = "node";
                    uVar3 = 1;
                    uVar9 = 0x16b;
                    goto LAB_001801dc;
                  }
                  local_90[uVar8 * 2] = 0.0;
                  (local_90 + uVar8 * 2)[1] = 0.0;
                  lVar5 = local_58;
                  pRVar7 = local_c0;
                  local_a8 = uVar8;
                  while (lVar5 = lVar5 + -1, lVar5 != 0) {
                    sVar13 = fread(pRVar7,8,1,(FILE *)file);
                    pRVar7 = pRVar7 + 1;
                    if (sVar13 != 1) {
                      pcVar12 = "param";
                      uVar9 = 0x170;
                      goto LAB_00180186;
                    }
                  }
                  *(REF_LONG *)((long)pvVar6 + local_a8 * 8) = *value;
                  if (0 < type) {
                    sVar13 = fread(&double_gref,8,1,(FILE *)file);
                    if (sVar13 != 1) {
                      pcVar12 = "gref";
                      uVar9 = 0x173;
LAB_00180186:
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,uVar9,"ref_part_meshb_geom_bcast",pcVar12,1,sVar13);
                      goto LAB_001800ae;
                    }
                    *(long *)((long)pvVar6 + local_a8 * 8) = (long)double_gref;
                  }
                  local_c0 = local_c0 + 2;
                  uVar8 = local_a8 + 1;
                }
                for (uVar8 = 0; local_70 != uVar8; uVar8 = uVar8 + 1) {
                  plVar1 = (long *)((long)__ptr + uVar8 * 8);
                  *plVar1 = *plVar1 + -1;
                }
              }
              ref_mpi = local_78;
              uVar8 = local_98;
              RVar10 = (REF_INT)local_98;
              local_68 = (FILE *)file;
              uVar3 = ref_mpi_bcast(local_78,__ptr,RVar10,2);
              if (uVar3 != 0) {
                pcVar12 = "nd";
                uVar9 = 0x179;
LAB_0018030d:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,uVar9,"ref_part_meshb_geom_bcast",(ulong)uVar3,pcVar12);
                return uVar3;
              }
              uVar3 = ref_mpi_bcast(ref_mpi,local_a0,RVar10,2);
              if (uVar3 != 0) {
                pcVar12 = "id";
                uVar9 = 0x17a;
                goto LAB_0018030d;
              }
              uVar3 = ref_mpi_bcast(ref_mpi,pvVar6,RVar10,2);
              pRVar7 = local_90;
              if (uVar3 != 0) {
                pcVar12 = "gref";
                uVar9 = 0x17b;
                goto LAB_0018030d;
              }
              uVar3 = ref_mpi_bcast(ref_mpi,local_90,RVar10 * 2,3);
              ref_geom_00 = local_48;
              if (uVar3 != 0) {
                pcVar12 = "pm";
                uVar9 = 0x17d;
                goto LAB_0018030d;
              }
              local_a8 = 0;
              if (0 < RVar10) {
                local_a8 = uVar8 & 0xffffffff;
              }
              local_c0 = pRVar7;
              local_50 = uVar11;
              for (uVar8 = 0; local_a8 != uVar8; uVar8 = uVar8 + 1) {
                uVar3 = ref_node_local(local_40,*(REF_GLOB *)((long)__ptr + uVar8 * 8),&local);
                if ((uVar3 != 0) && (uVar3 != 5)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x180,"ref_part_meshb_geom_bcast",(ulong)uVar3,"local");
                  local_80 = uVar3;
                }
                pvVar2 = local_a0;
                if ((uVar3 != 5) && (uVar3 != 0)) {
                  return local_80;
                }
                if (local != -1) {
                  uVar3 = ref_geom_add(ref_geom_00,local,type,
                                       *(REF_INT *)((long)local_a0 + uVar8 * 8),local_c0);
                  if (uVar3 != 0) {
                    pcVar12 = "add geom";
                    uVar9 = 0x184;
LAB_001801dc:
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,uVar9,"ref_part_meshb_geom_bcast",(ulong)uVar3,pcVar12);
                    return uVar3;
                  }
                  uVar3 = ref_geom_find(ref_geom_00,local,type,
                                        *(REF_INT *)((long)pvVar2 + uVar8 * 8),&new_geom);
                  if (uVar3 != 0) {
                    pcVar12 = "find";
                    uVar9 = 0x187;
                    goto LAB_001801dc;
                  }
                  ref_geom_00->descr[(long)new_geom * 6 + 2] =
                       *(REF_INT *)((long)pvVar6 + uVar8 * 8);
                  uVar11 = local_50;
                  pRVar7 = local_90;
                }
                local_c0 = local_c0 + 2;
              }
              lVar5 = local_60 + (int)local_98;
              file = (FILE *)local_68;
            } while( true );
          }
          pcVar12 = "malloc read_param of REF_DBL NULL";
          uVar9 = 0x163;
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar9,
           "ref_part_meshb_geom_bcast",pcVar12);
  }
  return RVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_part_meshb_geom_bcast(
    REF_GEOM ref_geom, REF_LONG ngeom, REF_INT type, REF_NODE ref_node,
    REF_INT version, FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT chunk;
  REF_LONG *read_node;
  REF_LONG *read_id;
  REF_LONG *read_gref;
  REF_DBL *read_param;
  REF_DBL double_gref;

  REF_LONG ngeom_read;
  REF_INT section_size;

  REF_INT geom, new_geom;
  REF_INT i, local;

  chunk = (REF_INT)MAX(1000000, ngeom / (REF_LONG)ref_mpi_n(ref_mpi));
  chunk = (REF_INT)MIN((REF_LONG)chunk, ngeom);

  ref_malloc(read_node, chunk, REF_LONG);
  ref_malloc(read_id, chunk, REF_LONG);
  ref_malloc(read_gref, chunk, REF_LONG);
  ref_malloc(read_param, 2 * chunk, REF_DBL);

  ngeom_read = 0;
  while (ngeom_read < ngeom) {
    section_size = MIN(chunk, (REF_INT)(ngeom - ngeom_read));
    if (ref_mpi_once(ref_mpi)) {
      for (geom = 0; geom < section_size; geom++) {
        RSS(ref_part_meshb_long(file, version, &(read_node[geom])), "node");
        RSS(ref_part_meshb_long(file, version, &(read_id[geom])), "node");
        for (i = 0; i < 2; i++)
          read_param[i + 2 * geom] = 0.0; /* ensure init */
        for (i = 0; i < type; i++)
          REIS(1, fread(&(read_param[i + 2 * geom]), sizeof(double), 1, file),
               "param");
        read_gref[geom] = read_id[geom];
        if (0 < type) {
          REIS(1, fread(&(double_gref), sizeof(double), 1, file), "gref");
          read_gref[geom] = (REF_LONG)double_gref;
        }
      }
      for (geom = 0; geom < section_size; geom++) read_node[geom]--;
    }
    RSS(ref_mpi_bcast(ref_mpi, read_node, section_size, REF_LONG_TYPE), "nd");
    RSS(ref_mpi_bcast(ref_mpi, read_id, section_size, REF_LONG_TYPE), "id");
    RSS(ref_mpi_bcast(ref_mpi, read_gref, section_size, REF_LONG_TYPE), "gref");
    RSS(ref_mpi_bcast(ref_mpi, read_param, 2 * section_size, REF_DBL_TYPE),
        "pm");
    for (geom = 0; geom < section_size; geom++) {
      RXS(ref_node_local(ref_node, read_node[geom], &local), REF_NOT_FOUND,
          "local");
      if (REF_EMPTY != local) {
        RSS(ref_geom_add(ref_geom, local, type, (REF_INT)read_id[geom],
                         &(read_param[2 * geom])),
            "add geom");
        RSS(ref_geom_find(ref_geom, local, type, (REF_INT)read_id[geom],
                          &new_geom),
            "find");
        ref_geom_gref(ref_geom, new_geom) = (REF_INT)read_gref[geom];
      }
    }
    ngeom_read += section_size;
  }

  ref_free(read_param);
  ref_free(read_gref);
  ref_free(read_id);
  ref_free(read_node);

  return REF_SUCCESS;
}